

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project-mon.c
# Opt level: O3

void project_monster_resist_other
               (project_monster_handler_context_t *context,wchar_t flag,wchar_t factor,_Bool reduce,
               mon_messages msg)

{
  _Bool _Var1;
  uint32_t uVar2;
  
  if (context->seen == true) {
    flag_on_dbg(context->lore->flags,0xb,flag,"context->lore->flags","flag");
  }
  _Var1 = flag_has_dbg(context->mon->race->flags,0xb,flag,"context->mon->race->flags","flag");
  if (_Var1) {
    context->hurt_msg = msg;
    context->dam = factor * context->dam;
    if (reduce) {
      uVar2 = Rand_div(6);
      context->dam = context->dam / (int)(uVar2 + 7);
    }
  }
  return;
}

Assistant:

static void project_monster_resist_other(project_monster_handler_context_t *context, int flag, int factor, bool reduce, enum mon_messages msg)
{
	if (context->seen) rf_on(context->lore->flags, flag);
	if (rf_has(context->mon->race->flags, flag)) {
		context->hurt_msg = msg;
		context->dam *= factor;

		if (reduce)
			context->dam /= randint1(6) + 6;
	}
}